

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O3

int ini_save(ini_t *ini,char *data,int size)

{
  ini_internal_property_t *piVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ini_internal_section_t *str;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  
  if (ini == (ini_t *)0x0) {
    iVar11 = 0;
  }
  else {
    if (ini->section_count < 1) {
      uVar10 = 0;
    }
    else {
      lVar9 = (long)size;
      uVar7 = 0;
      uVar10 = 0;
      do {
        str = (ini_internal_section_t *)ini->sections[uVar7].name_large;
        if (str == (ini_internal_section_t *)0x0) {
          str = ini->sections + uVar7;
        }
        uVar2 = sx_strlen(str->name);
        if (0 < (int)uVar2) {
          if ((data != (char *)0x0) && ((int)uVar10 < size)) {
            data[(int)uVar10] = '[';
          }
          lVar6 = (long)(int)(uVar10 + 1);
          lVar5 = lVar6 << 0x20;
          uVar3 = 0;
          do {
            if ((data != (char *)0x0) && ((long)(lVar6 + uVar3) < lVar9)) {
              data[uVar3 + lVar6] = str->name[uVar3];
            }
            uVar3 = uVar3 + 1;
            lVar5 = lVar5 + 0x100000000;
          } while (uVar2 != uVar3);
          iVar11 = (int)uVar3;
          if ((data != (char *)0x0) && ((int)(uVar10 + iVar11 + 1) < size)) {
            data[lVar5 >> 0x20] = ']';
          }
          if ((data != (char *)0x0) && (iVar4 = uVar10 + iVar11 + 2, iVar4 < size)) {
            data[iVar4] = '\n';
          }
          uVar10 = uVar10 + iVar11 + 3;
        }
        iVar11 = ini->property_count;
        if (0 < iVar11) {
          lVar5 = 0;
          do {
            piVar1 = ini->properties;
            if (uVar7 == (uint)piVar1[lVar5].section) {
              pcVar8 = piVar1[lVar5].name;
              if (piVar1[lVar5].name_large != (char *)0x0) {
                pcVar8 = piVar1[lVar5].name_large;
              }
              uVar2 = sx_strlen(pcVar8);
              if (0 < (int)uVar2) {
                uVar3 = 0;
                do {
                  if ((data != (char *)0x0) && ((long)((long)(int)uVar10 + uVar3) < lVar9)) {
                    data[uVar3 + (long)(int)uVar10] = pcVar8[uVar3];
                  }
                  uVar3 = uVar3 + 1;
                } while (uVar2 != uVar3);
                uVar10 = uVar10 + (int)uVar3;
              }
              if ((data != (char *)0x0) && ((int)uVar10 < size)) {
                data[(int)uVar10] = '=';
              }
              pcVar8 = ini->properties[lVar5].value_large;
              if (pcVar8 == (char *)0x0) {
                pcVar8 = ini->properties[lVar5].value;
              }
              uVar2 = sx_strlen(pcVar8);
              iVar11 = uVar10 + 1;
              if (0 < (int)uVar2) {
                lVar6 = (long)iVar11;
                uVar3 = (ulong)uVar2;
                do {
                  uVar2 = uVar10;
                  if ((data != (char *)0x0) && (lVar6 < lVar9)) {
                    data[lVar6] = *pcVar8;
                  }
                  lVar6 = lVar6 + 1;
                  pcVar8 = pcVar8 + 1;
                  uVar10 = uVar2 + 1;
                  uVar3 = uVar3 - 1;
                } while (uVar3 != 0);
                iVar11 = uVar2 + 2;
              }
              if ((data != (char *)0x0) && (iVar11 < size)) {
                data[iVar11] = '\n';
              }
              uVar10 = uVar10 + 2;
              iVar11 = ini->property_count;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < iVar11);
        }
        if (0 < (int)uVar10) {
          if ((data != (char *)0x0) && ((int)uVar10 < size)) {
            data[uVar10] = '\n';
          }
          uVar10 = uVar10 + 1;
        }
        uVar7 = uVar7 + 1;
      } while ((long)uVar7 < (long)ini->section_count);
    }
    if ((data != (char *)0x0) && ((int)uVar10 < size)) {
      data[(int)uVar10] = '\0';
    }
    iVar11 = uVar10 + 1;
  }
  return iVar11;
}

Assistant:

int ini_save( ini_t const* ini, char* data, int size )
    {
    int s;
    int p;
    int i;
    int l;
    char* n;
    int pos;

    if( ini )
        {
        pos = 0;
        for( s = 0; s < ini->section_count; ++s )
            {
            n = ini->sections[ s ].name_large ? ini->sections[ s ].name_large : ini->sections[ s ].name;
            l = (int) INI_STRLEN( n );
            if( l > 0 )
                {
                if( data && pos < size ) data[ pos ] = '[';
                ++pos;
                for( i = 0; i < l; ++i )
                    {
                    if( data && pos < size ) data[ pos ] = n[ i ];
                    ++pos;
                    }
                if( data && pos < size ) data[ pos ] = ']';
                ++pos;
                if( data && pos < size ) data[ pos ] = '\n';
                ++pos;
                }

            for( p = 0; p < ini->property_count; ++p )
                {
                if( ini->properties[ p ].section == s )
                    {
                    n = ini->properties[ p ].name_large ? ini->properties[ p ].name_large : ini->properties[ p ].name;
                    l = (int) INI_STRLEN( n );
                    for( i = 0; i < l; ++i )
                        {
                        if( data && pos < size ) data[ pos ] = n[ i ];
                        ++pos;
                        }
                    if( data && pos < size ) data[ pos ] = '=';
                    ++pos;
                    n = ini->properties[ p ].value_large ? ini->properties[ p ].value_large : ini->properties[ p ].value;
                    l = (int) INI_STRLEN( n );
                    for( i = 0; i < l; ++i )
                        {
                        if( data && pos < size ) data[ pos ] = n[ i ];
                        ++pos;
                        }
                    if( data && pos < size ) data[ pos ] = '\n';
                    ++pos;
                    }
                }

            if( pos > 0 )
                {
                if( data && pos < size ) data[ pos ] = '\n';
                ++pos;
                }
            }

        if( data && pos < size ) data[ pos ] = '\0';
        ++pos;

        return pos;
        }

    return 0;
    }